

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlutils.cpp
# Opt level: O0

bool QXmlUtils::rangeContains(RangeIter begin,RangeIter end,QChar c)

{
  undefined1 auVar1 [16];
  char16_t *pcVar2;
  char16_t cVar3;
  long lVar4;
  char16_t *pcVar5;
  char16_t *in_RSI;
  char16_t *in_RDI;
  long in_FS_OFFSET;
  RangeIter mid;
  qptrdiff delta;
  ushort cp;
  char16_t *local_20;
  char16_t *local_18;
  bool local_b;
  QChar local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  cVar3 = QChar::unicode(&local_a);
  if ((ushort)in_RDI[1] < (ushort)cVar3) {
    local_18 = in_RDI + 2;
    if (local_18 == in_RSI) {
      local_b = false;
    }
    else {
      local_20 = in_RSI;
      if ((ushort)in_RDI[3] < (ushort)cVar3) {
        do {
          if (local_18 == local_20) break;
          auVar1._8_8_ = (long)local_20 - (long)local_18 >> 0x3f;
          auVar1._0_8_ = (long)local_20 - (long)local_18 >> 2;
          lVar4 = SUB168(auVar1 / SEXT816(2),0);
          pcVar5 = local_18 + lVar4 * 2;
          pcVar2 = pcVar5;
          if (((ushort)*pcVar5 <= (ushort)cVar3) &&
             (pcVar2 = local_20, local_18 = pcVar5, (ushort)cVar3 <= (ushort)pcVar5[1])) {
            local_b = true;
            goto LAB_004b0a29;
          }
          local_20 = pcVar2;
        } while (lVar4 != 0);
        local_b = false;
      }
      else {
        local_b = (ushort)*local_18 <= (ushort)cVar3;
      }
    }
  }
  else {
    local_b = (ushort)*in_RDI <= (ushort)cVar3;
  }
LAB_004b0a29:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return local_b;
}

Assistant:

bool QXmlUtils::rangeContains(RangeIter begin, RangeIter end, const QChar c)
{
    const ushort cp(c.unicode());

    // check the first two ranges "manually" as characters in that
    // range are checked very often and we avoid the binary search below.

    if (cp <= begin->max)
        return cp >= begin->min;

    ++begin;

    if (begin == end)
        return false;

    if (cp <= begin->max)
        return cp >= begin->min;

    while (begin != end) {
        qptrdiff delta = (end - begin) / 2;
        RangeIter mid = begin + delta;

        if (mid->min > cp)
            end = mid;
        else if (mid->max < cp)
            begin = mid;
        else
            return true;

        if (delta == 0)
            break;
    }

    return false;
}